

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O3

String __thiscall Bstrlib::String::extractToken(String *this,char c,int *pos)

{
  uint len;
  uint uVar1;
  uint *in_RCX;
  uchar *puVar2;
  uchar *extraout_RDX;
  uchar *extraout_RDX_00;
  undefined7 in_register_00000031;
  long lVar3;
  ulong uVar4;
  String SVar5;
  String local_40;
  
  lVar3 = CONCAT71(in_register_00000031,c);
  String(this);
  len = *in_RCX;
  puVar2 = (uchar *)(ulong)len;
  uVar1 = *(uint *)(lVar3 + 4);
  if ((int)len < (int)uVar1) {
    if (-1 < (int)len) {
      uVar4 = (ulong)len;
      do {
        if (*(char *)(*(long *)(lVar3 + 8) + uVar4) == (char)pos) {
          if (uVar4 != 0xffffffff) goto LAB_0010c189;
          break;
        }
        uVar4 = uVar4 + 1;
      } while ((int)uVar4 < (int)uVar1);
    }
    uVar4 = (ulong)uVar1;
LAB_0010c189:
    midString(&local_40,(int)lVar3,len);
    operator=(this,&local_40);
    puVar2 = extraout_RDX;
    if (local_40.super_tagbstring.data != (uchar *)0x0) {
      free(local_40.super_tagbstring.data);
      puVar2 = extraout_RDX_00;
    }
    *in_RCX = (int)uVar4 + 1;
  }
  SVar5.super_tagbstring.data = puVar2;
  SVar5.super_tagbstring._0_8_ = this;
  return (String)SVar5.super_tagbstring;
}

Assistant:

String String::extractToken(char c, int & pos) const
    {
        String ret;
        if (pos >= slen) return ret;

        int findNextPos = Find(c, pos);
        if (findNextPos == -1) findNextPos = slen;
        ret = midString(pos, findNextPos - pos);
        pos = findNextPos + 1;
        return ret;
    }